

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModelBullet.cpp
# Opt level: O3

void __thiscall
chrono::collision::ChCollisionModelBullet::SyncPosition(ChCollisionModelBullet *this)

{
  undefined8 uVar1;
  cbtCollisionObject *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ChCoordsys<double> mcsys;
  undefined1 local_a8 [16];
  double local_98;
  ChQuaternion<double> local_90;
  undefined1 local_68 [16];
  double local_58;
  undefined1 local_50 [16];
  double local_40;
  undefined1 local_38 [16];
  double local_28;
  
  (*((this->super_ChCollisionModel).mcontactable)->_vptr_ChContactable[0xb])(local_a8);
  auVar3 = vcvtpd2ps_avx(local_a8);
  pcVar2 = (this->bt_collision_object)._M_t.
           super___uniq_ptr_impl<cbtCollisionObject,_std::default_delete<cbtCollisionObject>_>._M_t.
           super__Tuple_impl<0UL,_cbtCollisionObject_*,_std::default_delete<cbtCollisionObject>_>.
           super__Head_base<0UL,_cbtCollisionObject_*,_false>._M_head_impl;
  uVar1 = vmovlps_avx(auVar3);
  *(undefined8 *)(pcVar2->m_worldTransform).m_origin.m_floats = uVar1;
  (pcVar2->m_worldTransform).m_origin.m_floats[2] = (float)local_98;
  (pcVar2->m_worldTransform).m_origin.m_floats[3] = 0.0;
  ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)local_68,&local_90);
  auVar3 = vcvtpd2ps_avx(local_68);
  auVar4 = vcvtpd2ps_avx(local_50);
  auVar5 = vcvtpd2ps_avx(local_38);
  pcVar2 = (this->bt_collision_object)._M_t.
           super___uniq_ptr_impl<cbtCollisionObject,_std::default_delete<cbtCollisionObject>_>._M_t.
           super__Tuple_impl<0UL,_cbtCollisionObject_*,_std::default_delete<cbtCollisionObject>_>.
           super__Head_base<0UL,_cbtCollisionObject_*,_false>._M_head_impl;
  uVar1 = vmovlps_avx(auVar3);
  *(undefined8 *)(pcVar2->m_worldTransform).m_basis.m_el = uVar1;
  (pcVar2->m_worldTransform).m_basis.m_el[0].m_floats[2] = (float)local_58;
  (pcVar2->m_worldTransform).m_basis.m_el[0].m_floats[3] = 0.0;
  uVar1 = vmovlps_avx(auVar4);
  *(undefined8 *)(pcVar2->m_worldTransform).m_basis.m_el[1].m_floats = uVar1;
  (pcVar2->m_worldTransform).m_basis.m_el[1].m_floats[2] = (float)local_40;
  (pcVar2->m_worldTransform).m_basis.m_el[1].m_floats[3] = 0.0;
  uVar1 = vmovlps_avx(auVar5);
  *(undefined8 *)(pcVar2->m_worldTransform).m_basis.m_el[2].m_floats = uVar1;
  (pcVar2->m_worldTransform).m_basis.m_el[2].m_floats[2] = (float)local_28;
  (pcVar2->m_worldTransform).m_basis.m_el[2].m_floats[3] = 0.0;
  return;
}

Assistant:

void ChCollisionModelBullet::SyncPosition() {
    ChCoordsys<> mcsys = mcontactable->GetCsysForCollisionModel();

    bt_collision_object->getWorldTransform().setOrigin(
        cbtVector3((cbtScalar)mcsys.pos.x(), (cbtScalar)mcsys.pos.y(), (cbtScalar)mcsys.pos.z()));
    const ChMatrix33<>& rA(mcsys.rot);
    cbtMatrix3x3 basisA((cbtScalar)rA(0, 0), (cbtScalar)rA(0, 1), (cbtScalar)rA(0, 2), (cbtScalar)rA(1, 0),
                        (cbtScalar)rA(1, 1), (cbtScalar)rA(1, 2), (cbtScalar)rA(2, 0), (cbtScalar)rA(2, 1),
                        (cbtScalar)rA(2, 2));
    bt_collision_object->getWorldTransform().setBasis(basisA);
}